

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
 __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::insert<Rml::Element*&>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **val)

{
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
  pVar2;
  
  __position._M_current = (Element **)lower_bound<Rml::Element*>(this,val);
  if ((__position._M_current == *(Element ***)(this + 8)) || (*val < *__position._M_current)) {
    __position._M_current =
         (Element **)
         std::vector<Rml::Element*,std::allocator<Rml::Element*>>::_M_emplace_aux<Rml::Element*&>
                   ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)this,
                    (const_iterator)__position._M_current,val);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_current = __position._M_current;
  return pVar2;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }